

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_RCX;
  JSAMPARRAY in_RDX;
  long in_RSI;
  long in_RDI;
  INT32 outvalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JDIMENSION output_cols;
  JDIMENSION outcol_h;
  JDIMENSION outcol;
  int v;
  int h;
  int numpix2;
  int numpix;
  int v_expand;
  int h_expand;
  int outrow;
  int inrow;
  my_downsample_ptr downsample;
  long local_70;
  undefined1 *local_68;
  byte *local_60;
  uint local_50;
  uint local_4c;
  int local_48;
  int local_44;
  int local_30;
  int local_2c;
  
  uVar1 = *(int *)(in_RSI + 0x1c) * *(int *)(in_RSI + 0x24);
  uVar2 = (uint)*(byte *)(*(long *)(in_RDI + 0x220) + 0x90 + (long)*(int *)(in_RSI + 4));
  uVar3 = (uint)*(byte *)(*(long *)(in_RDI + 0x220) + 0x9a + (long)*(int *)(in_RSI + 4));
  expand_right_edge(in_RDX,*(int *)(in_RDI + 0x160),*(JDIMENSION *)(in_RDI + 0x30),uVar1 * uVar2);
  local_30 = 0;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x160); local_2c = uVar3 + local_2c) {
    local_50 = 0;
    local_68 = *(undefined1 **)(in_RCX + (long)local_30 * 8);
    for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 1) {
      local_70 = 0;
      for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
        local_60 = in_RDX[local_2c + local_48] + local_50;
        for (local_44 = 0; local_44 < (int)uVar2; local_44 = local_44 + 1) {
          local_70 = (int)(uint)*local_60 + local_70;
          local_60 = local_60 + 1;
        }
      }
      *local_68 = (char)((local_70 + (int)((uVar2 * uVar3) / 2)) / (long)(int)(uVar2 * uVar3));
      local_50 = uVar2 + local_50;
      local_68 = local_68 + 1;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
		JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;	/* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  JSAMPROW inptr, outptr;
  INT32 outvalue;

  h_expand = downsample->h_expand[compptr->component_index];
  v_expand = downsample->v_expand[compptr->component_index];
  numpix = h_expand * v_expand;
  numpix2 = numpix/2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor,
		    cinfo->image_width, output_cols * h_expand);

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
	 outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
	inptr = input_data[inrow+v] + outcol_h;
	for (h = 0; h < h_expand; h++) {
	  outvalue += (INT32) GETJSAMPLE(*inptr++);
	}
      }
      *outptr++ = (JSAMPLE) ((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
    outrow++;
  }
}